

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

binary_op_t pugi::impl::anon_unknown_0::xpath_parser::binary_op_t::parse(xpath_lexer *lexer)

{
  lexeme_t lVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  xpath_lexer_string *this;
  binary_op_t bVar6;
  
  lVar1 = lexer->_cur_lexeme;
  uVar5 = 0x400000000;
  iVar4 = 3;
  switch(lVar1) {
  case lex_equal:
    uVar3 = 3;
    break;
  case lex_not_equal:
    uVar3 = 4;
    break;
  case lex_less:
    uVar3 = 5;
    goto LAB_00115077;
  case lex_greater:
    uVar3 = 6;
    goto LAB_00115077;
  case lex_less_or_equal:
    uVar3 = 7;
    goto LAB_00115077;
  case lex_greater_or_equal:
    uVar3 = 8;
LAB_00115077:
    iVar4 = 4;
    break;
  case lex_plus:
    uVar3 = 9;
    goto LAB_00115091;
  case lex_minus:
    uVar3 = 10;
LAB_00115091:
    iVar4 = 5;
LAB_001150b8:
    uVar5 = 0x200000000;
    break;
  case lex_multiply:
    uVar3 = 0xb;
    iVar4 = 6;
    goto LAB_001150b8;
  case lex_union:
    uVar5 = 0x100000000;
    iVar4 = 7;
    uVar3 = 0xf;
    break;
  default:
    iVar4 = 0;
    uVar5 = 0;
    uVar3 = 0;
    break;
  case lex_string:
    this = &lexer->_cur_lexeme_contents;
    bVar2 = xpath_lexer_string::operator==(this,"or");
    if (bVar2) {
      iVar4 = 1;
      uVar3 = 1;
    }
    else {
      if ((lex_string < lVar1) || ((0x10c800U >> (lVar1 & (lex_double_dot|lex_plus)) & 1) == 0)) {
LAB_00115186:
        __assert_fail("_cur_lexeme == lex_var_ref || _cur_lexeme == lex_number || _cur_lexeme == lex_string || _cur_lexeme == lex_quoted_string"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2498,
                      "const xpath_lexer_string &pugi::impl::(anonymous namespace)::xpath_lexer::contents() const"
                     );
      }
      bVar2 = xpath_lexer_string::operator==(this,(char_t *)"and");
      if (bVar2) {
        iVar4 = 2;
        uVar3 = 2;
      }
      else {
        if ((lex_string < lVar1) || ((0x10c800U >> (lVar1 & (lex_double_dot|lex_plus)) & 1) == 0))
        goto LAB_00115186;
        uVar5 = 0x200000000;
        bVar2 = xpath_lexer_string::operator==(this,(char_t *)"div");
        if (bVar2) {
          iVar4 = 6;
          uVar3 = 0xc;
        }
        else {
          if ((lex_string < lVar1) || ((0x10c800U >> (lVar1 & (lex_double_dot|lex_plus)) & 1) == 0))
          goto LAB_00115186;
          bVar2 = xpath_lexer_string::operator==(this,(char_t *)"mod");
          iVar4 = 6;
          if (!bVar2) {
            uVar5 = 0;
            iVar4 = 0;
          }
          uVar3 = 0xd;
          if (!bVar2) {
            uVar3 = 0;
          }
        }
      }
    }
  }
  bVar6.precedence = iVar4;
  bVar6.asttype = (int)(uVar5 | uVar3);
  bVar6.rettype = (int)((uVar5 | uVar3) >> 0x20);
  return bVar6;
}

Assistant:

lexeme_t current() const
		{
			return _cur_lexeme;
		}